

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ
          (internal *this,char *expected_expression,char *actual_expression,BiggestInt expected,
          BiggestInt actual)

{
  String *extraout_RDX;
  AssertionResult AVar2;
  String local_50;
  String local_40;
  BiggestInt local_30;
  BiggestInt actual_local;
  BiggestInt expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<testing::internal::String> sVar1;
  
  local_30 = actual;
  actual_local = expected;
  expected_local = (BiggestInt)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  if (expected == actual) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<long_long,long_long>((longlong *)&local_40,&actual_local);
    FormatForComparisonFailureMessage<long_long,long_long>((longlong *)&local_50,&local_30);
    EqFailure(this,expected_expression,actual_expression,&local_40,&local_50,false);
    String::~String(&local_50);
    String::~String(&local_40);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            BiggestInt expected,
                            BiggestInt actual) {
  if (expected == actual) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}